

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

void Au_NtkCleanCopy(Au_Ntk_t *p)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = (long)((p->vPages).nSize * 0x1000 + -0x1000) + (long)p->iHandle;
  iVar2 = (int)uVar3;
  if ((p->vCopies).nCap < iVar2) {
    piVar1 = (p->vCopies).pArray;
    if (piVar1 == (int *)0x0) {
      piVar1 = (int *)malloc(uVar3 * 4);
    }
    else {
      piVar1 = (int *)realloc(piVar1,uVar3 * 4);
    }
    (p->vCopies).pArray = piVar1;
    if (piVar1 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = iVar2;
  }
  if (0 < iVar2) {
    memset((p->vCopies).pArray,0xff,(uVar3 & 0xffffffff) << 2);
  }
  (p->vCopies).nSize = iVar2;
  return;
}

Assistant:

void Au_NtkCleanCopy( Au_Ntk_t * p )
{
    Vec_IntFill( &p->vCopies, Au_NtkObjNumMax(p), -1 );
}